

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::DiagStackFrame::GetThisFromFrame
          (DiagStackFrame *this,IDiagObjectAddress **ppOutAddress,
          IDiagObjectModelWalkerBase *localsWalker)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FunctionBody *this_00;
  JavascriptLibrary *this_01;
  ParseableFunctionInfo *this_02;
  ThreadContext *this_03;
  DebugManager *this_04;
  ReferencedArenaAdapter *this_05;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  ScriptContext *this_06;
  _func_int **pp_Var5;
  GlobalObject *this_07;
  ModuleID local_a4;
  IDiagObjectAddress *address;
  code *pcStack_88;
  bool unused;
  undefined8 local_80;
  TrackAllocData local_78;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_50;
  ArenaAllocator *arena;
  Var varThis;
  JavascriptFunction *pJStack_38;
  ModuleID moduleId;
  JavascriptFunction *scopeFunction;
  ScriptContext *scriptContext;
  IDiagObjectModelWalkerBase *localsWalker_local;
  IDiagObjectAddress **ppOutAddress_local;
  DiagStackFrame *this_local;
  undefined4 extraout_var_01;
  
  scriptContext = (ScriptContext *)localsWalker;
  localsWalker_local = (IDiagObjectModelWalkerBase *)ppOutAddress;
  ppOutAddress_local = (IDiagObjectAddress **)this;
  iVar2 = (*this->_vptr_DiagStackFrame[10])();
  scopeFunction = (JavascriptFunction *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this->_vptr_DiagStackFrame[2])();
  pJStack_38 = (JavascriptFunction *)CONCAT44(extraout_var_00,iVar2);
  BVar3 = JavascriptFunction::IsScriptFunction(pJStack_38);
  if (BVar3 == 0) {
    local_a4 = 0;
  }
  else {
    this_00 = JavascriptFunction::GetFunctionBody(pJStack_38);
    local_a4 = FunctionBody::GetModuleID(this_00);
  }
  varThis._4_4_ = local_a4;
  this_01 = ScriptContext::GetLibrary((ScriptContext *)scopeFunction);
  arena = (ArenaAllocator *)JavascriptLibraryBase::GetNull(&this_01->super_JavascriptLibraryBase);
  BVar3 = JavascriptFunction::IsLambda(pJStack_38);
  if (BVar3 == 0) {
    JavascriptStackWalker::GetThis(&arena,varThis._4_4_,pJStack_38,(ScriptContext *)scopeFunction);
  }
  else {
    this_02 = JavascriptFunction::GetParseableFunctionInfo(pJStack_38);
    bVar1 = FunctionProxy::GetCapturesThis(&this_02->super_FunctionProxy);
    if (!bVar1) {
      return (Var)0x0;
    }
    if (scriptContext == (ScriptContext *)0x0) {
      this_03 = ScriptContext::GetThreadContext((ScriptContext *)scopeFunction);
      this_04 = ThreadContext::GetDebugManager(this_03);
      this_05 = DebugManager::GetDiagnosticArena(this_04);
      pAVar4 = &Memory::ReferencedArenaAdapter::Arena(this_05)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      local_50 = pAVar4;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,(type_info *)&LocalsWalker::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                 ,0x85);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_78);
      pcStack_88 = Memory::ArenaAllocator::Alloc;
      local_80 = 0;
      this_06 = (ScriptContext *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar4,0x3f67b0)
      ;
      LocalsWalker::LocalsWalker((LocalsWalker *)this_06,this,6);
      scriptContext = this_06;
    }
    address._7_1_ = 0;
    iVar2 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[3])
                      (scriptContext,0x2d5,(long)&address + 7);
    pp_Var5 = (_func_int **)CONCAT44(extraout_var_01,iVar2);
    if (localsWalker_local != (IDiagObjectModelWalkerBase *)0x0) {
      localsWalker_local->_vptr_IDiagObjectModelWalkerBase = pp_Var5;
    }
    if (pp_Var5 == (_func_int **)0x0) {
      if (varThis._4_4_ == 0) {
        this_07 = Js::JavascriptOperators::OP_LdRoot((ScriptContext *)scopeFunction);
        arena = (ArenaAllocator *)GlobalObject::ToThis(this_07);
      }
      else {
        arena = (ArenaAllocator *)
                Js::JavascriptOperators::GetModuleRoot(varThis._4_4_,(ScriptContext *)scopeFunction)
        ;
      }
    }
    else {
      arena = (ArenaAllocator *)(**(code **)(*pp_Var5 + 0x10))(pp_Var5,0);
    }
  }
  BVar3 = IsStrictMode(this);
  if (BVar3 == 0) {
    GlobalObject::UpdateThisForEval(&arena,varThis._4_4_,(ScriptContext *)scopeFunction);
  }
  return arena;
}

Assistant:

Js::Var DiagStackFrame::GetThisFromFrame(Js::IDiagObjectAddress ** ppOutAddress, Js::IDiagObjectModelWalkerBase * localsWalker)
    {
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        Js::JavascriptFunction* scopeFunction = this->GetJavascriptFunction();
        Js::ModuleID moduleId = scopeFunction->IsScriptFunction() ? scopeFunction->GetFunctionBody()->GetModuleID() : 0;
        Js::Var varThis = scriptContext->GetLibrary()->GetNull();

        if (!scopeFunction->IsLambda())
        {
            Js::JavascriptStackWalker::GetThis(&varThis, moduleId, scopeFunction, scriptContext);
        }
        else
        {
            if (!scopeFunction->GetParseableFunctionInfo()->GetCapturesThis())
            {
                return nullptr;
            }
            else
            {
                // Emulate Js::JavascriptOperators::OP_GetThisScoped using a locals walker and assigning moduleId object if not found by locals walker
                if (localsWalker == nullptr)
                {
                    ArenaAllocator *arena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena()->Arena();
                    localsWalker = Anew(arena, Js::LocalsWalker, this, Js::FrameWalkerFlags::FW_EnumWithScopeAlso | Js::FrameWalkerFlags::FW_AllowLexicalThis);
                }

                bool unused = false;
                Js::IDiagObjectAddress* address = localsWalker->FindPropertyAddress(Js::PropertyIds::_this, unused);

                if (ppOutAddress != nullptr)
                {
                    *ppOutAddress = address;
                }

                if (address != nullptr)
                {
                    varThis = address->GetValue(FALSE);
                }
                else if (moduleId == kmodGlobal)
                {
                    varThis = Js::JavascriptOperators::OP_LdRoot(scriptContext)->ToThis();
                }
                else
                {
                    varThis = (Var)Js::JavascriptOperators::GetModuleRoot(moduleId, scriptContext);
                }
            }
        }

        if (!this->IsStrictMode())
        {
            Js::GlobalObject::UpdateThisForEval(varThis, moduleId, scriptContext);
        }
        return varThis;
    }